

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_intersect.cpp
# Opt level: O0

int ON_Intersect(ON_Line *line,ON_Cylinder *cylinder,ON_3dPoint *A,ON_3dPoint *B)

{
  ON_3dPoint point;
  ON_3dPoint point_00;
  bool bVar1;
  double d_00;
  double dVar2;
  ON_3dVector local_478;
  ON_3dPoint local_460;
  ON_3dVector local_448;
  ON_3dVector local_430;
  undefined1 local_418 [8];
  ON_3dVector V_1;
  undefined8 uStack_3f8;
  double local_3f0;
  ON_3dPoint local_3e8;
  ON_3dPoint local_3d0;
  ON_3dPoint local_3b8;
  int local_39c;
  double dStack_398;
  int qerc;
  double t1;
  double t0;
  double cy;
  double by;
  double ay;
  double y1my0;
  double y1;
  double y0;
  double cx;
  double bx;
  double ax;
  double x1mx0;
  double x1;
  double x0;
  ON_Line L;
  ON_Xform xform;
  ON_3dPoint local_260;
  double local_248;
  double dStack_240;
  double local_238;
  ON_3dPoint local_228;
  ON_3dPoint local_210;
  undefined1 auStack_1f8 [8];
  ON_3dPoint P;
  ON_3dVector local_1d8;
  ON_3dPoint local_1c0;
  ON_3dVector local_1a8;
  ON_3dVector local_190;
  undefined1 local_178 [8];
  ON_3dVector V;
  double d;
  ON_3dPoint axis_point;
  ON_3dPoint line_point;
  double axis_t;
  double line_t;
  double local_f8;
  double local_f0;
  ON_3dVector local_e8;
  ON_3dPoint local_d0;
  ON_3dVector local_a8;
  ON_3dPoint local_90;
  undefined1 auStack_78 [8];
  ON_Line axis;
  double local_40;
  double tol;
  double cylinder_radius;
  int rc;
  bool bFiniteCyl;
  ON_3dPoint *B_local;
  ON_3dPoint *A_local;
  ON_Cylinder *cylinder_local;
  ON_Line *line_local;
  
  d_00 = ABS((cylinder->circle).radius);
  local_40 = d_00 * 1.490116119385e-08;
  if (local_40 < 2.3283064365386963e-10) {
    local_40 = 2.3283064365386963e-10;
  }
  ON_Line::ON_Line((ON_Line *)auStack_78);
  operator*(&local_a8,cylinder->height[0],&(cylinder->circle).plane.zaxis);
  ON_3dPoint::operator+(&local_90,(ON_3dPoint *)cylinder,&local_a8);
  axis.from.y = local_90.z;
  auStack_78 = (undefined1  [8])local_90.x;
  axis.from.x = local_90.y;
  operator*(&local_e8,cylinder->height[1],&(cylinder->circle).plane.zaxis);
  ON_3dPoint::operator+(&local_d0,(ON_3dPoint *)cylinder,&local_e8);
  axis.to.y = local_d0.z;
  axis.from.z = local_d0.x;
  axis.to.x = local_d0.y;
  dVar2 = ON_Line::Length((ON_Line *)auStack_78);
  if (dVar2 <= local_40) {
    ON_3dPoint::operator+
              ((ON_3dPoint *)&line_t,(ON_3dPoint *)cylinder,&(cylinder->circle).plane.zaxis);
    axis.from.z = line_t;
    axis.to.x = local_f8;
    axis.to.y = local_f0;
  }
  cylinder_radius._7_1_ = dVar2 > local_40;
  bVar1 = ON_Intersect(line,(ON_Line *)auStack_78,&axis_t,&line_point.z);
  if (!bVar1) {
    ON_Line::ClosestPointTo((ON_Line *)auStack_78,(ON_3dPoint *)cylinder,&line_point.z);
    ON_Line::ClosestPointTo(line,(ON_3dPoint *)cylinder,&axis_t);
  }
  ON_Line::PointAt((ON_3dPoint *)&axis_point.z,line,axis_t);
  ON_Line::PointAt((ON_3dPoint *)&d,(ON_Line *)auStack_78,line_point.z);
  dVar2 = ON_3dPoint::DistanceTo((ON_3dPoint *)&axis_point.z,(ON_3dPoint *)&d);
  if (cylinder_radius._7_1_) {
    if (0.0 <= line_point.z) {
      if (1.0 < line_point.z) {
        line_point.z = 1.0;
      }
    }
    else {
      line_point.z = 0.0;
    }
    ON_Line::PointAt((ON_3dPoint *)&V.z,(ON_Line *)auStack_78,line_point.z);
    d = V.z;
  }
  if (dVar2 < d_00 - local_40) {
    ON_Xform::ON_Xform((ON_Xform *)&L.to.z);
    ON_Xform::Rotation((ON_Xform *)&L.to.z,(ON_Plane *)cylinder,&ON_xy_plane);
    x0 = (line->from).x;
    L.from.x = (line->from).y;
    L.from.y = (line->from).z;
    L.from.z = (line->to).x;
    L.to.x = (line->to).y;
    L.to.y = (line->to).z;
    ON_Line::Transform((ON_Line *)&x0,(ON_Xform *)&L.to.z);
    x1 = x0;
    x1mx0 = L.from.z;
    ax = L.from.z - x0;
    bx = ax * ax;
    cx = (ax + ax) * x0;
    y0 = x0 * x0;
    y1 = L.from.x;
    y1my0 = L.to.x;
    ay = L.to.x - L.from.x;
    by = ay * ay;
    cy = (ay + ay) * L.from.x;
    t0 = L.from.x * L.from.x;
    local_39c = ON_SolveQuadraticEquation
                          (bx + by,cx + cy,(y0 + t0) - d_00 * d_00,&t1,&stack0xfffffffffffffc68);
    if (local_39c == 2) {
      dStack_398 = t1;
    }
    ON_Line::PointAt(&local_3d0,line,t1);
    point.y = local_3d0.y;
    point.x = local_3d0.x;
    point.z = local_3d0.z;
    ON_Cylinder::ClosestPointTo(&local_3b8,cylinder,point);
    A->z = local_3b8.z;
    A->x = local_3b8.x;
    A->y = local_3b8.y;
    ON_Line::PointAt((ON_3dPoint *)&V_1.z,line,dStack_398);
    point_00.y = (double)uStack_3f8;
    point_00.x = V_1.z;
    point_00.z = local_3f0;
    ON_Cylinder::ClosestPointTo(&local_3e8,cylinder,point_00);
    B->z = local_3e8.z;
    B->x = local_3e8.x;
    B->y = local_3e8.y;
    dVar2 = ON_3dPoint::DistanceTo(A,B);
    if (2.3283064365386963e-10 < dVar2) {
      cylinder_radius._0_4_ = 2;
    }
    else {
      A->z = line_point.y;
      A->x = axis_point.z;
      A->y = line_point.x;
      ON_3dPoint::operator-((ON_3dVector *)local_418,(ON_3dPoint *)&axis_point.z,(ON_3dPoint *)&d);
      if (cylinder_radius._7_1_) {
        dVar2 = ON_3dVector::operator*((ON_3dVector *)local_418,&(cylinder->circle).plane.zaxis);
        operator*(&local_448,dVar2,&(cylinder->circle).plane.zaxis);
        ON_3dVector::operator-(&local_430,(ON_3dVector *)local_418,&local_448);
        local_418 = (undefined1  [8])local_430.x;
        V_1.x = local_430.y;
        V_1.y = local_430.z;
      }
      ON_3dVector::Unitize((ON_3dVector *)local_418);
      operator*(&local_478,d_00,(ON_3dVector *)local_418);
      ON_3dPoint::operator+(&local_460,(ON_3dPoint *)&d,&local_478);
      B->x = local_460.x;
      B->y = local_460.y;
      B->z = local_460.z;
      cylinder_radius._0_4_ = 1;
    }
    ON_Line::~ON_Line((ON_Line *)&x0);
  }
  else {
    cylinder_radius._0_4_ = (uint)(dVar2 <= d_00 + local_40);
    A->z = line_point.y;
    A->x = axis_point.z;
    A->y = line_point.x;
    ON_3dPoint::operator-((ON_3dVector *)local_178,(ON_3dPoint *)&axis_point.z,(ON_3dPoint *)&d);
    if (cylinder_radius._7_1_) {
      dVar2 = ON_3dVector::operator*((ON_3dVector *)local_178,&(cylinder->circle).plane.zaxis);
      operator*(&local_1a8,dVar2,&(cylinder->circle).plane.zaxis);
      ON_3dVector::operator-(&local_190,(ON_3dVector *)local_178,&local_1a8);
      local_178 = (undefined1  [8])local_190.x;
      V.x = local_190.y;
      V.y = local_190.z;
    }
    ON_3dVector::Unitize((ON_3dVector *)local_178);
    operator*(&local_1d8,d_00,(ON_3dVector *)local_178);
    ON_3dPoint::operator+(&local_1c0,(ON_3dPoint *)&d,&local_1d8);
    B->x = local_1c0.x;
    B->y = local_1c0.y;
    B->z = local_1c0.z;
    if (cylinder_radius._0_4_ == 1) {
      ON_Line::ClosestPointTo((ON_3dPoint *)auStack_1f8,(ON_Line *)auStack_78,&line->from);
      dVar2 = ON_3dPoint::DistanceTo((ON_3dPoint *)auStack_1f8,&line->from);
      if (ABS(dVar2 - d_00) <= local_40) {
        ON_Line::ClosestPointTo(&local_210,(ON_Line *)auStack_78,&line->to);
        P.y = local_210.z;
        auStack_1f8 = (undefined1  [8])local_210.x;
        P.x = local_210.y;
        dVar2 = ON_3dPoint::DistanceTo((ON_3dPoint *)auStack_1f8,&line->to);
        if (ABS(dVar2 - d_00) <= local_40) {
          cylinder_radius._0_4_ = 3;
          local_238 = (line->from).z;
          local_248 = (line->from).x;
          dStack_240 = (line->from).y;
          ON_Cylinder::ClosestPointTo(&local_228,cylinder,line->from);
          A->z = local_228.z;
          A->x = local_228.x;
          A->y = local_228.y;
          ON_Cylinder::ClosestPointTo(&local_260,cylinder,line->to);
          B->x = local_260.x;
          B->y = local_260.y;
          B->z = local_260.z;
        }
      }
    }
  }
  ON_Line::~ON_Line((ON_Line *)auStack_78);
  return cylinder_radius._0_4_;
}

Assistant:

int ON_Intersect(
        const ON_Line& line, 
        const ON_Cylinder& cylinder, // if cylinder.height[0]==cylinder.height[1],
                                     // then infinite cyl is used.  Otherwise
                                     // finite cyl is used.
        ON_3dPoint& A, ON_3dPoint& B // intersection point(s) returned here
        )
{
  bool bFiniteCyl = true;
  int rc = 0;
  const double cylinder_radius = fabs(cylinder.circle.radius);
  double tol = cylinder_radius*ON_SQRT_EPSILON;
  if ( tol < ON_ZERO_TOLERANCE )
    tol = ON_ZERO_TOLERANCE;

  ON_Line axis;
  axis.from = cylinder.circle.plane.origin + cylinder.height[0]*cylinder.circle.plane.zaxis;
  axis.to   = cylinder.circle.plane.origin + cylinder.height[1]*cylinder.circle.plane.zaxis;
  if ( axis.Length() <= tol ) {
    axis.to = cylinder.circle.plane.origin + cylinder.circle.plane.zaxis;
    bFiniteCyl = false;
  }


  //bool bIsParallel = false;
  double line_t, axis_t;
  if ( !ON_Intersect(line,axis,&line_t,&axis_t) ) {
    axis.ClosestPointTo( cylinder.circle.plane.origin, &axis_t );
    line.ClosestPointTo( cylinder.circle.plane.origin, &line_t );
  }
  ON_3dPoint line_point = line.PointAt(line_t);
  ON_3dPoint axis_point = axis.PointAt(axis_t);
  double d = line_point.DistanceTo(axis_point);
  if ( bFiniteCyl ) {
    if ( axis_t < 0.0 )
      axis_t = 0.0;
    else if ( axis_t > 1.0 )
      axis_t = 1.0;
    axis_point = axis.PointAt(axis_t);
  }
  
  if ( d >= cylinder_radius-tol) {
    rc = ( d <= cylinder_radius+tol ) ? 1 : 0;
    A = line_point;
    ON_3dVector V = line_point - axis_point;
    if ( bFiniteCyl ) {
      V = V - (V*cylinder.circle.plane.zaxis)*cylinder.circle.plane.zaxis;
    }
    V.Unitize();
    B = axis_point + cylinder_radius*V;
    if ( rc == 1 ) {
      // check for overlap
      ON_3dPoint P = axis.ClosestPointTo(line.from);
      d = P.DistanceTo(line.from);
      if ( fabs(d-cylinder_radius) <= tol ) {
        P = axis.ClosestPointTo(line.to);
        d = P.DistanceTo(line.to);
        if ( fabs(d-cylinder_radius) <= tol ) {
          rc = 3;
          A = cylinder.ClosestPointTo(line.from);
          B = cylinder.ClosestPointTo(line.to);
        }
      }
    }
  }
  else {
    // transform to coordinate system where equation of cyl
    // is x^2 + y^2 = R^2 and solve for line parameter(s).
    ON_Xform xform;
    xform.Rotation( cylinder.circle.plane, ON_xy_plane );
    ON_Line L = line;
    L.Transform(xform);

    const double x0 = L.from.x;
    const double x1 = L.to.x;
    const double x1mx0 = x1-x0;
    double ax = x1mx0*x1mx0;
    double bx = 2.0*x1mx0*x0;
    double cx = x0*x0;

    const double y0 = L.from.y;
    const double y1 = L.to.y;
    const double y1my0 = y1-y0;
    double ay = y1my0*y1my0;
    double by = 2.0*y1my0*y0;
    double cy = y0*y0;

    double t0, t1;
    int qerc = ON_SolveQuadraticEquation(ax+ay, bx+by, cx+cy-cylinder_radius*cylinder_radius,
                                         &t0,&t1);
    if ( qerc == 2 ) {
      // complex roots - ignore (tiny) imaginary part caused by computational noise.
      t1 = t0;
    }
    A = cylinder.ClosestPointTo(line.PointAt(t0));
    B = cylinder.ClosestPointTo(line.PointAt(t1));

    d = A.DistanceTo(B);
    if ( d <= ON_ZERO_TOLERANCE ) {
      A = line_point;
      ON_3dVector V = line_point - axis_point;
      if ( bFiniteCyl ) {
        V = V - (V*cylinder.circle.plane.zaxis)*cylinder.circle.plane.zaxis;
      }
      V.Unitize();
      B = axis_point + cylinder_radius*V;
      rc = 1;
    }    
    else
      rc = 2;
  }
  return rc;
}